

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

int64_t __thiscall LLVMBC::APInt::getSExtValue(APInt *this)

{
  uint32_t uVar1;
  IntegerType *this_00;
  ulong uVar2;
  ulong uVar3;
  
  this_00 = cast<LLVMBC::IntegerType>(this->type);
  uVar1 = IntegerType::getBitWidth(this_00);
  if (uVar1 == 0x40) {
    uVar2 = this->value;
  }
  else {
    uVar3 = -1L << ((byte)uVar1 & 0x3f);
    uVar2 = 0;
    if ((this->value >> ((ulong)(byte)((byte)uVar1 - 1) & 0x3f) & 1) != 0) {
      uVar2 = uVar3;
    }
    uVar2 = ~uVar3 & this->value | uVar2;
  }
  return uVar2;
}

Assistant:

int64_t APInt::getSExtValue() const
{
	auto width = cast<IntegerType>(type)->getBitWidth();
	if (width == 64)
		return int64_t(value);
	auto mask = (1ull << width) - 1;
	bool sign_bit = ((value >> (width - 1)) & 1) != 0;
	uint64_t extended = sign_bit ? ~mask : 0ull;
	return int64_t((value & mask) | extended);
}